

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_init_key(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx,
                  EC_KEY *eckey)

{
  int local_2c;
  st_x9_62_keyex_context_t *psStack_28;
  int ret;
  st_x9_62_keyex_context_t *ctx;
  EC_KEY *eckey_local;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  psStack_28 = (st_x9_62_keyex_context_t *)0x0;
  ctx = (st_x9_62_keyex_context_t *)eckey;
  eckey_local = (EC_KEY *)_ctx;
  _ctx_local = (ptls_key_exchange_context_t **)algo;
  local_2c = x9_62_create_context(algo,&stack0xffffffffffffffd8);
  if (local_2c == 0) {
    psStack_28->privkey = (EC_KEY *)ctx;
    local_2c = x9_62_setup_pubkey(psStack_28);
    if (local_2c == 0) {
      local_2c = 0;
    }
  }
  if (local_2c == 0) {
    *(st_x9_62_keyex_context_t **)eckey_local = psStack_28;
  }
  else {
    if (psStack_28 != (st_x9_62_keyex_context_t *)0x0) {
      x9_62_free_context(psStack_28);
    }
    *(undefined8 *)eckey_local = 0;
  }
  return local_2c;
}

Assistant:

static int x9_62_init_key(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx, EC_KEY *eckey)
{
    struct st_x9_62_keyex_context_t *ctx = NULL;
    int ret;

    if ((ret = x9_62_create_context(algo, &ctx)) != 0)
        goto Exit;
    ctx->privkey = eckey;
    if ((ret = x9_62_setup_pubkey(ctx)) != 0)
        goto Exit;
    ret = 0;

Exit:
    if (ret == 0) {
        *_ctx = &ctx->super;
    } else {
        if (ctx != NULL)
            x9_62_free_context(ctx);
        *_ctx = NULL;
    }
    return ret;
}